

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

ktx_error_code_e ktxMemStream_read(ktxStream *str,void *dst,ktx_size_t count)

{
  long *plVar1;
  ulong uVar2;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ktx_uint8_t *bytes;
  ktx_off_t newpos;
  ktxMem *mem;
  long local_40;
  ktx_error_code_e local_4;
  
  if ((in_RDI == 0) || (plVar1 = *(long **)(in_RDI + 0x40), plVar1 == (long *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    uVar2 = plVar1[4] + in_RDX;
    if (((long)uVar2 < plVar1[4]) || ((ulong)plVar1[3] < uVar2)) {
      local_4 = KTX_FILE_UNEXPECTED_EOF;
    }
    else {
      if (*plVar1 == 0) {
        local_40 = plVar1[1];
      }
      else {
        local_40 = *plVar1;
      }
      memcpy(in_RSI,(void *)(local_40 + plVar1[4]),in_RDX);
      plVar1[4] = uVar2;
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxMemStream_read(ktxStream* str, void* dst, const ktx_size_t count)
{
    ktxMem* mem;
    ktx_off_t newpos;
    const ktx_uint8_t* bytes;


    if (!str || (mem = str->data.mem)== 0)
        return KTX_INVALID_VALUE;

    newpos = mem->pos + count;
    /* The first clause checks for overflow. */
    if (newpos < mem->pos || (ktx_size_t)newpos > mem->used_size)
        return KTX_FILE_UNEXPECTED_EOF;

    bytes = mem->robytes ? mem->robytes : mem->bytes;
    memcpy(dst, bytes + mem->pos, count);
    mem->pos = newpos;

    return KTX_SUCCESS;
}